

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

int64_t __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::ConnectIndex
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,int con)

{
  ostream *poVar1;
  void *this_00;
  long *plVar2;
  int in_ESI;
  long in_RDI;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  long local_8;
  
  if ((in_ESI < 0) || (5 < in_ESI)) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "TPZCompElHDiv::ConnectIndex wrong parameter connect ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
    poVar1 = std::operator<<(poVar1," NConnects ");
    this_00 = (void *)std::ostream::operator<<(poVar1,5);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
    local_8 = -1;
  }
  else {
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0xc0),(long)in_ESI);
    local_8 = *plVar2;
  }
  return local_8;
}

Assistant:

int64_t TPZCompElHDiv<TSHAPE>::ConnectIndex(int con) const{
#ifndef PZNODEBUG
	if(con<0 || con > TSHAPE::NFacets) {
		std::cout << "TPZCompElHDiv::ConnectIndex wrong parameter connect " << con <<
		" NConnects " << TSHAPE::NFacets << std::endl;
		DebugStop();
		return -1;
	}

#endif

	return this->fConnectIndexes[con];
}